

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O1

DdNode * cuddRemapUnderApprox(DdManager *dd,DdNode *f,int numVars,int threshold,double quality)

{
  double dVar1;
  DdNode *pDVar2;
  FILE *__stream;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ApproxInfo *info;
  DdLevelQueue *queue;
  DdLevelQueue *queue_00;
  void *pvVar7;
  ulong uVar8;
  DdNode *pDVar9;
  uint uVar10;
  DdNode *g;
  DdNode *key;
  uint *puVar11;
  undefined8 uVar12;
  double dVar13;
  undefined8 uVar14;
  double dVar15;
  double dVar16;
  NodeData *infoE;
  NodeData *infoT;
  NodeData *infoN;
  uint local_a4;
  DdNode *local_80;
  double local_78;
  double *local_60;
  double *local_58;
  double *local_50;
  int local_44;
  double local_40;
  char *local_38;
  
  if (f == (DdNode *)0x0) {
    fwrite("Cannot subset, nil object\n",0x1a,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INVALID_ARG;
  }
  else {
    puVar11 = (uint *)((ulong)f & 0xfffffffffffffffe);
    if (*puVar11 == 0x7fffffff) {
      return f;
    }
    local_40 = quality;
    info = gatherInfo(dd,f,numVars,1);
    if (info == (ApproxInfo *)0x0) {
      fwrite("Out-of-memory; Cannot subset\n",0x1d,1,(FILE *)dd->err);
    }
    else {
      queue = cuddLevelQueueInit(dd->size,0x28,info->size);
      if (queue != (DdLevelQueue *)0x0) {
        queue_00 = cuddLevelQueueInit(dd->size,0x20,dd->initSlots);
        if (queue_00 != (DdLevelQueue *)0x0) {
          iVar4 = 0x7fffffff;
          if ((ulong)*puVar11 != 0x7fffffff) {
            iVar4 = dd->perm[*puVar11];
          }
          pvVar7 = cuddLevelQueueEnqueue(queue,puVar11,iVar4);
          if (pvVar7 != (void *)0x0) {
            uVar12 = 0x3ff0000000000000;
            if (((ulong)f & 1) == 0) {
              uVar14 = 0x3ff0000000000000;
              uVar12 = 0;
            }
            else {
              uVar14 = 0;
            }
            *(undefined8 *)((long)pvVar7 + 0x18) = uVar14;
            *(undefined8 *)((long)pvVar7 + 0x20) = uVar12;
            pvVar7 = queue->first;
            do {
              while( true ) {
                if ((pvVar7 == (void *)0x0) || (info->size <= threshold)) {
                  cuddLevelQueueQuit(queue);
                  cuddLevelQueueQuit(queue_00);
                  pDVar9 = RAbuildSubset(dd,f,info);
                  if ((pDVar9 != (DdNode *)0x0) &&
                     (iVar4 = info->size, iVar5 = Cudd_DagSize(pDVar9), iVar4 < iVar5)) {
                    __stream = (FILE *)dd->err;
                    uVar10 = info->size;
                    uVar6 = Cudd_DagSize(pDVar9);
                    fprintf(__stream,"Wrong prediction: %d versus actual %d\n",(ulong)uVar10,
                            (ulong)uVar6);
                  }
                  if (info->page != (NodeData *)0x0) {
                    free(info->page);
                    info->page = (NodeData *)0x0;
                  }
                  st__free_table(info->table);
                  free(info);
                  return pDVar9;
                }
                pDVar9 = *(DdNode **)((long)pvVar7 + 0x10);
                iVar4 = st__lookup(info->table,(char *)pDVar9,(char **)&local_50);
                if (iVar4 == 0) goto LAB_0076e278;
                if (*(short *)((long)local_50 + 0x16) != 3) break;
                iVar4 = 0x7fffffff;
                if ((ulong)pDVar9->index != 0x7fffffff) {
                  iVar4 = dd->perm[pDVar9->index];
                }
                cuddLevelQueueDequeue(queue,iVar4);
                pvVar7 = queue->first;
              }
              pDVar2 = (pDVar9->type).kids.T;
              g = (pDVar9->type).kids.E;
              dVar1 = *(double *)((long)pvVar7 + 0x18);
              dVar15 = *(double *)((long)pvVar7 + 0x20);
              iVar4 = Cudd_bddLeq(dd,pDVar2,g);
              if (iVar4 == 0) {
                iVar4 = Cudd_bddLeq(dd,g,pDVar2);
                key = (DdNode *)((ulong)g & 0xfffffffffffffffe);
                if (iVar4 != 0) {
                  st__lookup(info->table,(char *)pDVar2,(char **)&local_58);
                  st__lookup(info->table,(char *)key,(char **)&local_60);
                  if (*(short *)((long)local_50 + 0x16) == 1) {
                    dVar16 = *local_58 * 0.5 - local_60[g != key] * 0.5;
                    dVar13 = dVar1;
                    if ((*(int *)(local_58 + 2) != 1) ||
                       (*(int *)((ulong)pDVar2 & 0xfffffffffffffffe) == 0x7fffffff)) {
                      iVar4 = 1;
                      uVar10 = 1;
                      goto LAB_0076de29;
                    }
                    iVar4 = computeSavings(dd,pDVar2,(DdNode *)0x0,info,queue_00);
                    if (iVar4 != 0) {
                      iVar4 = iVar4 + 1;
                      uVar10 = 1;
                      goto LAB_0076de29;
                    }
LAB_0076e18c:
                    cuddLevelQueueQuit(queue);
                    cuddLevelQueueQuit(queue_00);
                    iVar4 = 1;
                    bVar3 = false;
                  }
                  else {
                    dVar16 = local_60[g == key] * 0.5 - local_58[1] * 0.5;
                    iVar4 = 1;
                    dVar13 = dVar15;
                    uVar10 = 2;
                    if ((*(int *)(local_60 + 2) == 1) && (key->index != 0x7fffffff)) {
                      iVar4 = computeSavings(dd,g,(DdNode *)0x0,info,queue_00);
                      if (iVar4 == 0) goto LAB_0076e18c;
                      iVar4 = iVar4 + 1;
                      uVar10 = 2;
                    }
LAB_0076de29:
                    local_a4 = uVar10;
                    local_78 = dVar16 * dVar13;
                    bVar3 = true;
                  }
                  if (bVar3) goto LAB_0076de3b;
                  goto LAB_0076e28c;
                }
                if (pDVar2->index == key->index) {
                  uVar8 = (ulong)((uint)g & 1);
                  local_80 = (pDVar2->type).kids.T;
                  if (local_80 == (DdNode *)((ulong)(key->type).kids.T ^ uVar8)) {
                    local_a4 = 4;
                  }
                  else {
                    local_80 = (pDVar2->type).kids.E;
                    if (local_80 != (DdNode *)(uVar8 ^ (ulong)(key->type).kids.E))
                    goto LAB_0076ddbd;
                    local_a4 = 5;
                  }
                }
                else {
LAB_0076ddbd:
                  local_a4 = 3;
                  local_80 = (DdNode *)0x0;
                }
                local_78 = *local_50 * dVar1 + local_50[1] * dVar15;
                iVar4 = computeSavings(dd,pDVar9,local_80,info,queue_00);
                if (local_80 != (DdNode *)0x0) {
                  local_44 = iVar4;
                  st__lookup(info->table,(char *)((ulong)local_80 & 0xfffffffffffffffe),&local_38);
                  local_78 = local_78 +
                             (*(double *)(local_38 + (-((uint)local_80 & 1) & 8)) * dVar1 +
                             *(double *)(local_38 + (ulong)(((ulong)local_80 & 1) == 0) * 8) *
                             dVar15) * -0.5;
                  iVar4 = local_44 + -1;
                }
              }
              else {
                st__lookup(info->table,(char *)pDVar2,(char **)&local_58);
                st__lookup(info->table,(char *)g,(char **)&local_60);
                if (*(short *)((long)local_50 + 0x16) == 1) {
                  local_78 = *local_60 * 0.5 - *local_58 * 0.5;
                  iVar4 = 1;
                  dVar13 = dVar1;
                  if ((*(int *)(local_60 + 2) == 1) &&
                     (local_a4 = 2, *(int *)((ulong)g & 0xfffffffffffffffe) != 0x7fffffff)) {
                    iVar4 = computeSavings(dd,g,(DdNode *)0x0,info,queue_00);
                    if (iVar4 == 0) break;
LAB_0076dd4b:
                    iVar4 = iVar4 + 1;
                  }
                  else {
                    local_a4 = 2;
                  }
                }
                else {
                  local_78 = local_58[1] * 0.5 - local_60[1] * 0.5;
                  dVar13 = dVar15;
                  if ((*(int *)(local_58 + 2) == 1) &&
                     (local_a4 = 1, *(int *)((ulong)pDVar2 & 0xfffffffffffffffe) != 0x7fffffff)) {
                    iVar4 = computeSavings(dd,pDVar2,(DdNode *)0x0,info,queue_00);
                    if (iVar4 != 0) goto LAB_0076dd4b;
                    break;
                  }
                  local_a4 = 1;
                  iVar4 = 1;
                }
                local_78 = local_78 * dVar13;
LAB_0076de3b:
                local_80 = (DdNode *)0x0;
              }
              iVar5 = 0x7fffffff;
              if ((ulong)pDVar9->index != 0x7fffffff) {
                iVar5 = dd->perm[pDVar9->index];
              }
              cuddLevelQueueDequeue(queue,iVar5);
              dVar13 = info->minterms;
              iVar5 = info->size;
              uVar10 = 0;
              if ((1.0 - (double)iVar4 / (double)iVar5) * local_40 < 1.0 - local_78 / dVar13) {
                *(char *)((long)local_50 + 0x15) = (char)local_a4;
                info->size = iVar5 - iVar4;
                info->minterms = dVar13 - local_78;
                if ((local_a4 == 1) || (g = pDVar2, local_a4 == 2)) {
LAB_0076df08:
                  iVar5 = updateRefs(dd,pDVar9,g,info,queue_00);
                }
                else {
                  if (local_a4 == 3) {
                    g = (DdNode *)0x0;
                    goto LAB_0076df08;
                  }
                  iVar5 = updateRefs(dd,pDVar9,local_80,info,queue_00);
                  iVar5 = iVar5 + -1;
                }
                uVar10 = local_a4;
                if (iVar4 != iVar5) {
                  __assert_fail("savings == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddApprox.c"
                                ,0x640,
                                "int RAmarkNodes(DdManager *, DdNode *, ApproxInfo *, int, double)")
                  ;
                }
              }
              local_a4 = 3;
              if (uVar10 != 3) {
                if ((uVar10 & 0xfffffffd) == 0) {
                  pDVar2 = (pDVar9->type).kids.T;
                  uVar8 = (ulong)pDVar2->index;
                  if (uVar8 != 0x7fffffff) {
                    pvVar7 = cuddLevelQueueEnqueue(queue,pDVar2,dd->perm[uVar8]);
                    if (uVar10 == 2) {
                      *(double *)((long)pvVar7 + 0x18) = *(double *)((long)pvVar7 + 0x18) + dVar1;
                      dVar13 = dVar15;
                    }
                    else {
                      *(double *)((long)pvVar7 + 0x18) =
                           dVar1 * 0.5 + *(double *)((long)pvVar7 + 0x18);
                      dVar13 = dVar15 * 0.5;
                    }
                    *(double *)((long)pvVar7 + 0x20) = dVar13 + *(double *)((long)pvVar7 + 0x20);
                  }
                }
                if (uVar10 < 2) {
                  puVar11 = (uint *)((ulong)(pDVar9->type).kids.E & 0xfffffffffffffffe);
                  uVar8 = (ulong)*puVar11;
                  if (uVar8 != 0x7fffffff) {
                    pvVar7 = cuddLevelQueueEnqueue(queue,puVar11,dd->perm[uVar8]);
                    if ((undefined1  [16])((undefined1  [16])pDVar9->type & (undefined1  [16])0x1)
                        == (undefined1  [16])0x0) {
                      if (uVar10 == 1) {
                        *(double *)((long)pvVar7 + 0x18) = *(double *)((long)pvVar7 + 0x18) + dVar1;
                        dVar13 = dVar15;
                      }
                      else {
                        *(double *)((long)pvVar7 + 0x18) =
                             dVar1 * 0.5 + *(double *)((long)pvVar7 + 0x18);
                        dVar13 = dVar15;
LAB_0076e08b:
                        dVar13 = dVar13 * 0.5;
                      }
                    }
                    else {
                      if (uVar10 != 1) {
                        *(double *)((long)pvVar7 + 0x18) =
                             dVar15 * 0.5 + *(double *)((long)pvVar7 + 0x18);
                        dVar13 = dVar1;
                        goto LAB_0076e08b;
                      }
                      *(double *)((long)pvVar7 + 0x18) = *(double *)((long)pvVar7 + 0x18) + dVar15;
                      dVar13 = dVar1;
                    }
                    *(double *)((long)pvVar7 + 0x20) = dVar13 + *(double *)((long)pvVar7 + 0x20);
                  }
                }
                local_a4 = uVar10;
                if ((uVar10 & 0xfffffffe) == 4) {
                  uVar8 = (ulong)*(uint *)((ulong)local_80 & 0xfffffffffffffffe);
                  if (uVar8 != 0x7fffffff) {
                    pvVar7 = cuddLevelQueueEnqueue
                                       (queue,(uint *)((ulong)local_80 & 0xfffffffffffffffe),
                                        dd->perm[uVar8]);
                    dVar13 = dVar1;
                    if (((ulong)local_80 & 1) != 0) {
                      dVar13 = dVar15;
                      dVar15 = dVar1;
                    }
                    *(double *)((long)pvVar7 + 0x18) = dVar13 + *(double *)((long)pvVar7 + 0x18);
                    *(double *)((long)pvVar7 + 0x20) = dVar15 + *(double *)((long)pvVar7 + 0x20);
                  }
                }
              }
              pvVar7 = queue->first;
            } while( true );
          }
LAB_0076e278:
          cuddLevelQueueQuit(queue);
          queue = queue_00;
        }
        cuddLevelQueueQuit(queue);
      }
LAB_0076e28c:
      fwrite("Out-of-memory; Cannot subset\n",0x1d,1,(FILE *)dd->err);
      if (info->page != (NodeData *)0x0) {
        free(info->page);
        info->page = (NodeData *)0x0;
      }
      st__free_table(info->table);
      free(info);
    }
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddRemapUnderApprox(
  DdManager * dd /* DD manager */,
  DdNode * f /* current DD */,
  int  numVars /* maximum number of variables */,
  int  threshold /* threshold under which approximation stops */,
  double  quality /* minimum improvement for accepted changes */)
{
    ApproxInfo *info;
    DdNode *subset;
    int result;

    if (f == NULL) {
        fprintf(dd->err, "Cannot subset, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    if (Cudd_IsConstant(f)) {
        return(f);
    }

    /* Create table where node data are accessible via a hash table. */
    info = gatherInfo(dd, f, numVars, TRUE);
    if (info == NULL) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    /* Mark nodes that should be replaced by zero. */
    result = RAmarkNodes(dd, f, info, threshold, quality);
    if (result == 0) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        ABC_FREE(info->page);
        st__free_table(info->table);
        ABC_FREE(info);
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    /* Build the result. */
    subset = RAbuildSubset(dd, f, info);
#if 1
    if (subset && info->size < Cudd_DagSize(subset))
        (void) fprintf(dd->err, "Wrong prediction: %d versus actual %d\n",
                       info->size, Cudd_DagSize(subset));
#endif
    ABC_FREE(info->page);
    st__free_table(info->table);
    ABC_FREE(info);

#ifdef DD_DEBUG
    if (subset != NULL) {
        cuddRef(subset);
#if 0
        (void) Cudd_DebugCheck(dd);
        (void) Cudd_CheckKeys(dd);
#endif
        if (!Cudd_bddLeq(dd, subset, f)) {
            (void) fprintf(dd->err, "Wrong subset\n");
        }
        cuddDeref(subset);
        dd->errorCode = CUDD_INTERNAL_ERROR;
    }
#endif
    return(subset);

}